

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase828::run(TestCase828 *this)

{
  Builder output;
  Field field;
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  StringPtr name;
  Type type;
  Reader value;
  Reader value_00;
  ArrayPtr<const_char> input;
  Builder root;
  bool local_238;
  JsonCodec json;
  DebugComparison<kj::String_&,_const_char_(&)[52]> _kjCondition;
  String encoded;
  char *local_1d8;
  Builder nested;
  Builder local_1a8;
  TestStructHandler handler;
  Field local_150;
  MallocMessageBuilder message;
  
  handler.super_Handler<capnproto_test::capnp::test::TestOldVersion,_(capnp::Style)2>.
  super_HandlerBase._vptr_HandlerBase = (HandlerBase)&PTR_encodeBase_00654b88;
  handler.dynamicHandler.super_Handler<capnp::DynamicStruct,_(capnp::Style)2>.super_HandlerBase.
  _vptr_HandlerBase = (Handler<capnp::DynamicStruct,_(capnp::Style)2>)&PTR_encodeBase_00654be0;
  JsonCodec::JsonCodec(&json);
  message.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)(schemas::s_95b30dd14e01dda8 + 0x48);
  name.content.size_ = 5;
  name.content.ptr = "old3";
  StructSchema::getFieldByName(&local_150,(StructSchema *)&message,name);
  field.index = local_150.index;
  field._12_4_ = local_150._12_4_;
  field.parent.super_Schema.raw = local_150.parent.super_Schema.raw;
  field.proto._reader.segment = local_150.proto._reader.segment;
  field.proto._reader.capTable = local_150.proto._reader.capTable;
  field.proto._reader.data = local_150.proto._reader.data;
  field.proto._reader.pointers = local_150.proto._reader.pointers;
  field.proto._reader.dataSize = local_150.proto._reader.dataSize;
  field.proto._reader.pointerCount = local_150.proto._reader.pointerCount;
  field.proto._reader._38_2_ = local_150.proto._reader._38_2_;
  field.proto._reader.nestingLimit = local_150.proto._reader.nestingLimit;
  field.proto._reader._44_4_ = local_150.proto._reader._44_4_;
  type.field_4.schema = (RawBrandedSchema *)(schemas::s_95b30dd14e01dda8 + 0x48);
  type.baseType = STRUCT;
  type.listDepth = '\0';
  type.isImplicitParam = false;
  type.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  type._6_2_ = 0;
  JsonCodec::addFieldHandlerImpl(&json,field,type,(HandlerBase *)&handler);
  encoded.content.ptr = (char *)0x0;
  encoded.content.size_ = 0;
  encoded.content.disposer = (ArrayDisposer *)0x0;
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestOldVersion>
            (&root,&message.super_MessageBuilder);
  *(undefined8 *)root._builder.data = 0x7b;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2(&root,value);
  capnproto_test::capnp::test::TestOldVersion::Builder::initOld3(&nested,&root);
  value_00.super_StringPtr.content.size_ = 4;
  value_00.super_StringPtr.content.ptr = "bar";
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2(&nested,value_00);
  JsonCodec::encode<capnproto_test::capnp::test::TestOldVersion::Builder&>
            ((String *)&_kjCondition,&json,&root);
  kj::Array<char>::operator=(&encoded.content,(Array<char> *)&_kjCondition);
  kj::Array<char>::~Array((Array<char> *)&_kjCondition);
  local_1a8._0_8_ = &encoded.content;
  kj::_::DebugExpression<kj::String&>::operator==
            (&_kjCondition,(DebugExpression<kj::String&> *)&local_1a8,
             (char (*) [52])"{\"old1\":\"123\",\"old2\":\"foo\",\"old3\":[\"0\",\"bar\",null]}");
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[96],kj::_::DebugComparison<kj::String&,char_const(&)[52]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json-test.c++"
               ,0x34e,ERROR,
               "\"failed: expected \" \"encoded == \\\"{\\\\\\\"old1\\\\\\\":\\\\\\\"123\\\\\\\",\\\\\\\"old2\\\\\\\":\\\\\\\"foo\\\\\\\",\\\\\\\"old3\\\\\\\":[\\\\\\\"0\\\\\\\",\\\\\\\"bar\\\\\\\",null]}\\\"\", _kjCondition"
               ,(char (*) [96])
                "failed: expected encoded == \"{\\\"old1\\\":\\\"123\\\",\\\"old2\\\":\\\"foo\\\",\\\"old3\\\":[\\\"0\\\",\\\"bar\\\",null]}\""
               ,&_kjCondition);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestOldVersion>
            (&nested,&message.super_MessageBuilder);
  pcVar3 = (char *)encoded.content.size_;
  if (encoded.content.size_ != 0) {
    pcVar3 = encoded.content.ptr;
  }
  sVar2 = 0;
  if (encoded.content.size_ != 0) {
    sVar2 = encoded.content.size_ - 1;
  }
  output.builder.segment = nested._builder.segment;
  output.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x656bf0;
  output.builder.capTable = nested._builder.capTable;
  output.builder.data = nested._builder.data;
  output.builder.pointers = nested._builder.pointers;
  output.builder.dataSize = nested._builder.dataSize;
  output.builder.pointerCount = nested._builder.pointerCount;
  output.builder._38_2_ = nested._builder._38_2_;
  input.size_ = sVar2;
  input.ptr = pcVar3;
  JsonCodec::decode(&json,input,output);
  root._builder.segment = *nested._builder.data;
  root._builder.capTable._0_4_ = 0x7b;
  root._builder.data = anon_var_dwarf_3d166;
  root._builder.pointers = (WirePointer *)&DAT_00000005;
  root._builder.dataSize._0_1_ = root._builder.segment == (SegmentBuilder *)0x7b;
  if ((!(bool)(undefined1)root._builder.dataSize) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39],kj::_::DebugComparison<long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json-test.c++"
               ,0x356,ERROR,"\"failed: expected \" \"root.getOld1() == 123\", _kjCondition",
               (char (*) [39])"failed: expected root.getOld1() == 123",
               (DebugComparison<long,_int> *)&root);
  }
  local_1a8._0_8_ = "foo";
  capnproto_test::capnp::test::TestOldVersion::Builder::getOld2((Builder *)&_kjCondition,&nested);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&root,
             (DebugExpression<char_const(&)[4]> *)&local_1a8,(Builder *)&_kjCondition);
  if ((local_238 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[41],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json-test.c++"
               ,0x357,ERROR,"\"failed: expected \" \"\\\"foo\\\" == root.getOld2()\", _kjCondition",
               (char (*) [41])"failed: expected \"foo\" == root.getOld2()",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&root);
  }
  capnproto_test::capnp::test::TestOldVersion::Builder::getOld3((Builder *)&_kjCondition,&nested);
  root._builder.segment = *(SegmentBuilder **)_kjCondition.op.content.ptr;
  root._builder.capTable._0_4_ = 0;
  root._builder.data = anon_var_dwarf_3d166;
  root._builder.pointers = (WirePointer *)&DAT_00000005;
  root._builder.dataSize._0_1_ = root._builder.segment == (SegmentBuilder *)0x0;
  if ((!(bool)(undefined1)root._builder.dataSize) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39],kj::_::DebugComparison<long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json-test.c++"
               ,0x359,ERROR,"\"failed: expected \" \"nested.getOld1() == 0\", _kjCondition",
               (char (*) [39])"failed: expected nested.getOld1() == 0",
               (DebugComparison<long,_int> *)&root);
  }
  local_1d8 = "bar";
  capnproto_test::capnp::test::TestOldVersion::Builder::getOld2(&local_1a8,(Builder *)&_kjCondition)
  ;
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&root,
             (DebugExpression<char_const(&)[4]> *)&local_1d8,&local_1a8);
  if ((local_238 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[43],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json-test.c++"
               ,0x35a,ERROR,
               "\"failed: expected \" \"\\\"bar\\\" == nested.getOld2()\", _kjCondition",
               (char (*) [43])"failed: expected \"bar\" == nested.getOld2()",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&root);
  }
  bVar1 = capnproto_test::capnp::test::TestOldVersion::Builder::hasOld3((Builder *)&_kjCondition);
  root._builder.segment = (SegmentBuilder *)CONCAT71(root._builder.segment._1_7_,!bVar1);
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[35],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json-test.c++"
               ,0x35b,ERROR,"\"failed: expected \" \"!nested.hasOld3()\", _kjCondition",
               (char (*) [35])"failed: expected !nested.hasOld3()",(DebugExpression<bool> *)&root);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  kj::Array<char>::~Array(&encoded.content);
  JsonCodec::~JsonCodec(&json);
  return;
}

Assistant:

void encode(const JsonCodec& codec, test::TestOldVersion::Reader input, JsonValue::Builder output) const override {
    dynamicHandler.encode(codec, input, output);
  }